

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall mario::TimerQueue::handleRead(TimerQueue *this)

{
  Timestamp now;
  pointer ppVar1;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  expired;
  _Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  local_30;
  
  EventLoop::assertInLoopThread(this->_loop);
  now = Timestamp::now();
  detail::readTimerfd(this->_timerfd);
  getExpired((vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
              *)&local_30,this,now);
  this->_callingExpiredTimers = true;
  std::
  _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::clear(&(this->_cancelingTimers)._M_t);
  for (ppVar1 = local_30._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != local_30._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    std::function<void_()>::operator()(&ppVar1->second->_callback);
  }
  this->_callingExpiredTimers = false;
  reset(this,(vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
              *)&local_30,now);
  std::
  _Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::~_Vector_base(&local_30);
  return;
}

Assistant:

void TimerQueue::handleRead() {
    _loop->assertInLoopThread();
    Timestamp now(Timestamp::now());
    readTimerfd(_timerfd);

    std::vector<Entry> expired = getExpired(now);

    _callingExpiredTimers = true;
    _cancelingTimers.clear();
    for (auto it = expired.begin(); it != expired.end(); ++it) {
        it->second->run();
    }
    _callingExpiredTimers = false;

    reset(expired, now);
}